

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

char * __thiscall
fmt::v6::internal::utf8_to_utf16::utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *p)

{
  runtime_error *this_00;
  char *in_RSI;
  int error;
  uint32_t cp;
  wchar_t *in_stack_ffffffffffffffb8;
  buffer<wchar_t> *in_stack_ffffffffffffffc0;
  int local_18;
  uint32_t local_14;
  char *local_10;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = utf8_decode(in_RSI,&local_14,&local_18);
  if (local_18 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid utf8");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_14 < 0x10000) {
    buffer<wchar_t>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    local_14 = local_14 - 0x10000;
    buffer<wchar_t>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    buffer<wchar_t>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_10;
}

Assistant:

FMT_FUNC internal::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}